

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O0

void printrows(int vulnerability_id,FILE *finx,longlong size)

{
  uint local_34;
  uint local_30;
  VulnerabilityRow row;
  longlong i;
  longlong size_local;
  FILE *finx_local;
  int vulnerability_id_local;
  
  row.damage_bin_id = 0;
  row.probability = 0.0;
  for (; (long)row._4_8_ < size; row._4_8_ = row._4_8_ + 0xc) {
    fread(&local_34,0xc,1,(FILE *)finx);
    printf("%d, %d, %d, %.10e\n",(double)(float)row.intensity_bin_id,(ulong)(uint)vulnerability_id,
           (ulong)local_34,(ulong)local_30);
  }
  return;
}

Assistant:

inline void printrows(int vulnerability_id, FILE *finx, long long size)
{

	long long i = 0;
	while (i < size) {
		VulnerabilityRow row;
		fread(&row, sizeof(row), 1, finx);
		printf("%d, %d, %d, %.10e\n", vulnerability_id,
		       row.intensity_bin_id, row.damage_bin_id,
		       row.probability);
		i += sizeof(row);
	}

}